

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reductions.cpp
# Opt level: O2

void __thiscall MxxReduce_ReduceVec_Test::TestBody(MxxReduce_ReduceVec_Test *this)

{
  int iVar1;
  int i;
  long lVar2;
  char *pcVar3;
  long lVar4;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  AssertHelper local_a0;
  AssertionResult gtest_ar;
  int n;
  vector<int,_std::allocator<int>_> w;
  comm c;
  vector<int,_std::allocator<int>_> v;
  
  mxx::comm::comm(&c);
  n = 0xd;
  std::vector<int,_std::allocator<int>_>::vector(&v,0xd,(allocator_type *)&w);
  iVar1 = 0xd;
  for (lVar2 = 0; lVar2 < iVar1; lVar2 = lVar2 + 1) {
    v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[lVar2]
         = c.m_rank + (int)lVar2;
    iVar1 = n;
  }
  iVar1 = (c.m_size + -1) * c.m_size;
  mxx::reduce<int,std::plus<int>>(&w,(mxx *)&v,(long)c.m_size / 2 & 0xffffffff);
  if (c.m_rank == c.m_size / 2) {
    local_a8.ptr_._0_4_ =
         (int)((ulong)((long)w.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)w.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"n","(int)w.size()",&n,(int *)&local_a8);
    if (gtest_ar.success_ != false) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      lVar2 = 0;
      for (lVar4 = 0; lVar4 < n; lVar4 = lVar4 + 1) {
        local_a8.ptr_._0_4_ = c.m_size * (int)lVar4 + iVar1 / 2;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar,"ranksum + i*c.size()","w[i]",(int *)&local_a8,
                   (int *)((long)w.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar2));
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_a8);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
                     ,0xb0,pcVar3);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
          testing::internal::AssertHelper::~AssertHelper(&local_a0);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&local_a8);
          goto LAB_0010c045;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        lVar2 = lVar2 + 4;
      }
      goto LAB_0010c04a;
    }
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
               ,0xae,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
LAB_0010bfe5:
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_a8);
  }
  else {
    local_a0.data_._0_4_ = 0;
    local_a8.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)w.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)w.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start >> 2);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)&gtest_ar,"0u","w.size()",(uint *)&local_a0,(unsigned_long *)&local_a8);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_a8);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
                 ,0xb3,pcVar3);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
      goto LAB_0010bfe5;
    }
  }
LAB_0010c045:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
LAB_0010c04a:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&w.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v.super__Vector_base<int,_std::allocator<int>_>);
  mxx::comm::~comm(&c);
  return;
}

Assistant:

TEST(MxxReduce, ReduceVec) {
    mxx::comm c;
    int n = 13;
    std::vector<int> v(n);

    for (int i = 0; i < n; ++i) {
        v[i] = c.rank() + i;
    }

    int ranksum = (c.size() * (c.size()-1)) / 2;

    std::vector<int> w = mxx::reduce(v, c.size()/2, c);
    if (c.rank() == c.size()/2) {
        ASSERT_EQ(n, (int)w.size());
        for (int i = 0; i < n; ++i) {
            ASSERT_EQ(ranksum + i*c.size(), w[i]);
        }
    } else {
        ASSERT_EQ(0u, w.size());
    }
}